

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

void __thiscall MT32Emu::Synth::printPartialUsage(Synth *this,Bit32u sampleOffset)

{
  Bit32u BVar1;
  uint uVar2;
  ulong uVar3;
  uint partialUsage [9];
  
  PartialManager::getPerPartPartialUsage(this->partialManager,partialUsage);
  BVar1 = this->partialCount;
  uVar2 = PartialManager::getFreePartialCount(this->partialManager);
  uVar3 = (ulong)(BVar1 - uVar2);
  if (sampleOffset == 0) {
    printDebug(this,
               "Partial Usage: 1:%02d 2:%02d 3:%02d 4:%02d 5:%02d 6:%02d 7:%02d 8:%02d R: %02d  TOTAL: %02d"
               ,(ulong)partialUsage[0],(ulong)partialUsage[1],(ulong)partialUsage[2],
               (ulong)partialUsage[3],(ulong)partialUsage[4],(ulong)partialUsage[5],
               (ulong)partialUsage[6],(ulong)partialUsage[7],(ulong)partialUsage[8],uVar3);
  }
  else {
    printDebug(this,
               "[+%u] Partial Usage: 1:%02d 2:%02d 3:%02d 4:%02d 5:%02d 6:%02d 7:%02d 8:%02d R: %02d  TOTAL: %02d"
               ,(ulong)sampleOffset,(ulong)partialUsage[0],(ulong)partialUsage[1],
               (ulong)partialUsage[2],(ulong)partialUsage[3],(ulong)partialUsage[4],
               (ulong)partialUsage[5],(ulong)partialUsage[6],(ulong)partialUsage[7],
               (ulong)partialUsage[8],uVar3);
  }
  return;
}

Assistant:

void Synth::printPartialUsage(Bit32u sampleOffset) {
	unsigned int partialUsage[9];
	partialManager->getPerPartPartialUsage(partialUsage);
	if (sampleOffset > 0) {
		printDebug("[+%u] Partial Usage: 1:%02d 2:%02d 3:%02d 4:%02d 5:%02d 6:%02d 7:%02d 8:%02d R: %02d  TOTAL: %02d", sampleOffset, partialUsage[0], partialUsage[1], partialUsage[2], partialUsage[3], partialUsage[4], partialUsage[5], partialUsage[6], partialUsage[7], partialUsage[8], getPartialCount() - partialManager->getFreePartialCount());
	} else {
		printDebug("Partial Usage: 1:%02d 2:%02d 3:%02d 4:%02d 5:%02d 6:%02d 7:%02d 8:%02d R: %02d  TOTAL: %02d", partialUsage[0], partialUsage[1], partialUsage[2], partialUsage[3], partialUsage[4], partialUsage[5], partialUsage[6], partialUsage[7], partialUsage[8], getPartialCount() - partialManager->getFreePartialCount());
	}
}